

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  xpath_value_type xVar1;
  xpath_variable_set *this_01;
  char_t *pcVar2;
  size_t sVar3;
  double dVar4;
  char cVar5;
  byte bVar6;
  nodetest_t nVar7;
  size_t length;
  byte *pbVar8;
  xpath_ast_node *pxVar9;
  xpath_variable *__dest;
  char_t *pcVar10;
  xpath_ast_node *pxVar11;
  xpath_ast_node *pxVar12;
  xpath_parse_result *pxVar13;
  ulong uVar14;
  anon_union_8_5_7bd254c6_for__data aVar15;
  long lVar16;
  bool bVar17;
  lexeme_t lVar18;
  char *pcVar19;
  long lVar20;
  anon_union_8_5_7bd254c6_for__data *paVar21;
  ulong uVar22;
  anon_union_8_5_7bd254c6_for__data *paVar23;
  size_t __n;
  xpath_ast_node *args [2];
  bool local_59;
  anon_union_8_5_7bd254c6_for__data local_48;
  xpath_ast_node *pxStack_40;
  
  lVar18 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar18 - lex_minus) {
switchD_0012d9ca_caseD_9:
    pxVar9 = parse_location_path(this);
    return pxVar9;
  }
  this_00 = &this->_lexer;
  switch(lVar18) {
  case lex_minus:
    xpath_lexer::next(this_00);
    pxVar9 = parse_expression(this,7);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x0e';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    pxVar11->_left = pxVar9;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    return pxVar11;
  default:
    goto switchD_0012d9ca_caseD_9;
  case lex_var_ref:
switchD_0012d9ca_caseD_b:
    this_01 = this->_variables;
    if (this_01 == (xpath_variable_set *)0x0) {
      pxVar13 = this->_result;
      pcVar19 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar22 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      pcVar10 = this->_scratch;
      if ((0x1f < uVar22) &&
         (pcVar10 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar22 + 1), pcVar10 == (char_t *)0x0)) {
LAB_0012dd73:
        *this->_alloc->_error = true;
        return (xpath_ast_node *)0x0;
      }
      memcpy(pcVar10,pcVar2,uVar22);
      pcVar10[uVar22] = '\0';
      __dest = xpath_variable_set::_find(this_01,pcVar10);
      if (pcVar10 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar10);
      }
      if (__dest != (xpath_variable *)0x0) {
        xpath_lexer::next(this_00);
        xVar1 = __dest->_type;
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '\x14';
        pxVar11->_rettype = (char)xVar1;
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        goto LAB_0012dc8e;
      }
      pxVar13 = this->_result;
      pcVar19 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_0012d9ca_caseD_c:
    xpath_lexer::next(this_00);
    pxVar11 = parse_expression(this,0);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_00);
      goto LAB_0012dca2;
    }
    pxVar13 = this->_result;
    pcVar19 = "Expected \')\' to match an opening \'(\'";
    break;
  case lex_quoted_string:
switchD_0012d9ca_caseD_e:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar2 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x13327c;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
      *(char *)((long)__dest + __n) = '\0';
    }
    xpath_lexer::next(this_00);
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x12';
    pxVar11->_rettype = '\x03';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
LAB_0012dc8e:
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).string = (char_t *)__dest;
    goto LAB_0012dca2;
  case lex_number:
switchD_0012d9ca_caseD_f:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar22 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
    pcVar10 = this->_scratch;
    if ((0x1f < uVar22) &&
       (pcVar10 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar22 + 1), pcVar10 == (char_t *)0x0)) goto LAB_0012dd73;
    memcpy(pcVar10,pcVar2,uVar22);
    pcVar10[uVar22] = '\0';
    dVar4 = convert_string_to_number(pcVar10);
    if (pcVar10 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar10);
    }
    xpath_lexer::next(this_00);
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x13';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).number = dVar4;
LAB_0012dca2:
    sVar3 = this->_depth;
    lVar18 = (this->_lexer)._cur_lexeme;
    while (lVar18 == lex_open_square_brace) {
      xpath_lexer::next(this_00);
      uVar22 = this->_depth + 1;
      this->_depth = uVar22;
      if (0x400 < uVar22) {
        pxVar13 = this->_result;
        pcVar19 = "Exceeded maximum allowed query depth";
        goto LAB_0012de29;
      }
      if (pxVar11->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar19 = "Predicate has to be applied to node set";
        goto LAB_0012de29;
      }
      pxVar9 = parse_expression(this,0);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '\x11';
      pxVar12->_rettype = '\x01';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      pxVar12->_left = pxVar11;
      pxVar12->_right = pxVar9;
      pxVar12->_next = (xpath_ast_node *)0x0;
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar13 = this->_result;
        pcVar19 = "Expected \']\' to match an opening \'[\'";
        goto LAB_0012de29;
      }
      xpath_lexer::next(this_00);
      pxVar11 = pxVar12;
      lVar18 = (this->_lexer)._cur_lexeme;
    }
    this->_depth = sVar3;
    if (lVar18 != lex_double_slash) {
      if (lVar18 != lex_slash) {
        return pxVar11;
      }
      xpath_lexer::next(this_00);
      pxVar9 = pxVar11;
LAB_0012ddc4:
      pxVar9 = parse_relative_location_path(this,pxVar9);
      return pxVar9;
    }
    xpath_lexer::next(this_00);
    if (pxVar11->_rettype == '\x01') {
      pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar9->_type = '8';
      pxVar9->_rettype = '\x01';
      pxVar9->_axis = '\x05';
      pxVar9->_test = '\x02';
      pxVar9->_left = pxVar11;
      pxVar9->_right = (xpath_ast_node *)0x0;
      pxVar9->_next = (xpath_ast_node *)0x0;
      (pxVar9->_data).string = (char_t *)0x0;
      goto LAB_0012ddc4;
    }
    pxVar13 = this->_result;
    pcVar19 = "Step has to be applied to node set";
    break;
  case lex_string:
    pbVar8 = (byte *)this_00->_cur;
    do {
      bVar6 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar6] & 8) != 0);
    if ((bVar6 != 0x28) ||
       (nVar7 = parse_node_test_type
                          ((xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin,
                           (xpath_lexer_string *)(this->_lexer)._cur_lexeme_contents.end),
       nVar7 != nodetest_none)) goto switchD_0012d9ca_caseD_9;
    switch(lVar18) {
    case lex_var_ref:
      goto switchD_0012d9ca_caseD_b;
    case lex_open_brace:
      goto switchD_0012d9ca_caseD_c;
    default:
      pxVar13 = this->_result;
      pcVar19 = "Unrecognizable primary expression";
      break;
    case lex_quoted_string:
      goto switchD_0012d9ca_caseD_e;
    case lex_number:
      goto switchD_0012d9ca_caseD_f;
    case lex_string:
      goto switchD_0012da7a_caseD_14;
    }
  }
LAB_0012de29:
  pxVar13->error = pcVar19;
LAB_0012de2c:
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
switchD_0012da7a_caseD_14:
  local_48.string = (char_t *)0x0;
  pxStack_40 = (xpath_ast_node *)0x0;
  pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
  pcVar10 = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_00);
  if ((this->_lexer)._cur_lexeme != lex_open_brace) {
    pcVar19 = "Unrecognized function call";
    goto switchD_0012df51_caseD_64;
  }
  xpath_lexer::next(this_00);
  sVar3 = this->_depth;
  lVar18 = (this->_lexer)._cur_lexeme;
  uVar22 = 0;
  aVar15.string = (char_t *)0x0;
  pxVar9 = (xpath_ast_node *)0x0;
  if (lVar18 != lex_close_brace) {
    paVar23 = &local_48;
    uVar22 = 0;
    pxVar11 = (xpath_ast_node *)0x0;
    do {
      if (uVar22 != 0) {
        if (lVar18 != lex_comma) {
          pcVar19 = "No comma between function arguments";
          goto switchD_0012df51_caseD_64;
        }
        xpath_lexer::next(this_00);
      }
      uVar14 = this->_depth + 1;
      this->_depth = uVar14;
      if (0x400 < uVar14) {
        pcVar19 = "Exceeded maximum allowed query depth";
        goto switchD_0012df51_caseD_64;
      }
      pxVar9 = parse_expression(this,0);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      paVar21 = (anon_union_8_5_7bd254c6_for__data *)&pxVar11->_next;
      if (uVar22 < 2) {
        paVar21 = paVar23;
      }
      paVar21->variable = (xpath_variable *)pxVar9;
      uVar22 = uVar22 + 1;
      lVar18 = (this->_lexer)._cur_lexeme;
      paVar23 = paVar23 + 1;
      aVar15 = local_48;
      pxVar11 = pxVar9;
      pxVar9 = pxStack_40;
    } while (lVar18 != lex_close_brace);
  }
  xpath_lexer::next(this_00);
  this->_depth = sVar3;
  pcVar19 = "Unrecognized function or wrong parameter count";
  switch(*pcVar2) {
  case 'b':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("boolean"[lVar20] != pcVar2[lVar20]) goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 1) && ("boolean"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '-';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e92c;
    }
    break;
  case 'c':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("Unrecognized function or wrong parameter count"[lVar20 + 0x29] != pcVar2[lVar20])
        goto LAB_0012e568;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 != 1) || ("Unrecognized function or wrong parameter count"[lVar16 + 0x29] != '\0'))
    {
LAB_0012e568:
      if (pcVar10 != pcVar2) {
        lVar20 = 0;
        do {
          if ("contains"[lVar20] != pcVar2[lVar20]) goto LAB_0012e5c0;
          lVar20 = lVar20 + 1;
        } while (lVar16 != lVar20);
      }
      if ((uVar22 == 2) && ("contains"[lVar16] == '\0')) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '#';
        pxVar11->_rettype = '\x04';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
      }
      else {
LAB_0012e5c0:
        if (pcVar10 != pcVar2) {
          lVar20 = 0;
          do {
            if ("concat"[lVar20] != pcVar2[lVar20]) goto LAB_0012e7ce;
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
        if ((uVar22 < 2) || ("concat"[lVar16] != '\0')) {
LAB_0012e7ce:
          if (pcVar10 != pcVar2) {
            lVar20 = 0;
            do {
              if ("ceiling"[lVar20] != pcVar2[lVar20]) goto LAB_0012eafb;
              lVar20 = lVar20 + 1;
            } while (lVar16 != lVar20);
          }
          pcVar19 = "Unrecognized function or wrong parameter count";
          if (uVar22 == 1 && "ceiling"[lVar16] == '\0') {
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '6';
            pxVar11->_rettype = '\x02';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
            goto LAB_0012e92c;
          }
          break;
        }
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '!';
        pxVar11->_rettype = '\x03';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
      }
LAB_0012ea73:
      pxVar11->_left = (xpath_ast_node *)aVar15;
      pxVar11->_right = pxVar9;
LAB_0012ea80:
      pxVar11->_next = (xpath_ast_node *)0x0;
      goto LAB_0012dca2;
    }
    if (*(byte *)((long)&(aVar15.variable)->_type + 1) != 1) goto LAB_0012eb03;
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x17';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    goto LAB_0012e92c;
  case 'f':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("false"[lVar20] != pcVar2[lVar20]) goto LAB_0012e39c;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 0) && ("false"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '0';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
LAB_0012e45e:
      pxVar11->_left = (xpath_ast_node *)0x0;
      pxVar11->_right = (xpath_ast_node *)0x0;
      goto LAB_0012ea80;
    }
LAB_0012e39c:
    if (pcVar10 != pcVar2) {
      lVar20 = 0;
      do {
        if ("floor"[lVar20] != pcVar2[lVar20]) goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 1) && ("floor"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '5';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e92c;
    }
    break;
  case 'i':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("basic_string::_M_construct null not valid"[lVar20 + 0x27] != pcVar2[lVar20])
        goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 1) && ("basic_string::_M_construct null not valid"[lVar16 + 0x27] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x18';
      pxVar11->_rettype = '\x01';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e92c;
    }
    break;
  case 'l':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("last"[lVar20] != pcVar2[lVar20]) goto LAB_0012e630;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 0) && ("last"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x15';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e45e;
    }
LAB_0012e630:
    if (pcVar10 != pcVar2) {
      lVar20 = 0;
      do {
        if ("xml:lang"[lVar20 + 4] != pcVar2[lVar20]) goto LAB_0012e83c;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 1) && ("xml:lang"[lVar16 + 4] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '1';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e92c;
    }
LAB_0012e83c:
    if (pcVar10 != pcVar2) {
      lVar20 = 0;
      do {
        if ("local-name"[lVar20] != pcVar2[lVar20]) goto LAB_0012eafb;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if (uVar22 < 2) {
      pcVar19 = "Unrecognized function or wrong parameter count";
      if ("local-name"[lVar16] == '\0') {
        if ((uVar22 == 1) && (*(byte *)((long)&(aVar15.variable)->_type + 1) != 1))
        goto LAB_0012eb03;
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar5 = '\x1a' - (uVar22 == 0);
        goto LAB_0012e4e5;
      }
    }
    else {
LAB_0012eafb:
      pcVar19 = "Unrecognized function or wrong parameter count";
    }
    break;
  case 'n':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("Unknown variable: variable set does not contain the given name"[lVar20 + 0x3a] !=
            pcVar2[lVar20]) goto LAB_0012e475;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 < 2) &&
       ("Unknown variable: variable set does not contain the given name"[lVar16 + 0x3a] == '\0')) {
      if ((uVar22 != 1) || (*(byte *)((long)&(aVar15.variable)->_type + 1) == 1)) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar5 = '\x1e';
        goto LAB_0012e4e3;
      }
    }
    else {
LAB_0012e475:
      bVar17 = 1 < uVar22;
      if (pcVar10 != pcVar2) {
        lVar20 = 0;
        do {
          if ("namespace-uri"[lVar20] != pcVar2[lVar20]) goto LAB_0012e4f4;
          lVar20 = lVar20 + 1;
        } while (lVar16 != lVar20);
      }
      if (bVar17 || "namespace-uri"[lVar16] != '\0') {
LAB_0012e4f4:
        if (pcVar10 != pcVar2) {
          lVar20 = 0;
          do {
            if ("normalize-space"[lVar20] != pcVar2[lVar20]) goto LAB_0012e768;
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
        if (!bVar17 && "normalize-space"[lVar16] == '\0') {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar6 = uVar22 == 0 ^ 0x2b;
LAB_0012ea64:
          pxVar11->_type = bVar6;
          pxVar11->_rettype = '\x03';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
          goto LAB_0012ea73;
        }
LAB_0012e768:
        if (pcVar10 != pcVar2) {
          lVar20 = 0;
          do {
            if ("not"[lVar20] != pcVar2[lVar20]) goto LAB_0012e8b9;
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
        if ((uVar22 == 1) && ("not"[lVar16] == '\0')) {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar11->_type = '.';
          pxVar11->_rettype = '\x04';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
          goto LAB_0012e92c;
        }
LAB_0012e8b9:
        if (pcVar10 != pcVar2) {
          lVar20 = 0;
          do {
            if ("number"[lVar20] != pcVar2[lVar20]) goto LAB_0012eafb;
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
        pcVar19 = "Unrecognized function or wrong parameter count";
        if (!bVar17 && "number"[lVar16] == '\0') {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar6 = uVar22 == 0 ^ 0x33;
          goto LAB_0012e91d;
        }
        break;
      }
      if ((uVar22 != 1) || (*(byte *)((long)&(aVar15.variable)->_type + 1) == 1)) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar5 = '\x1c';
        goto LAB_0012e4e3;
      }
    }
LAB_0012eb03:
    pcVar19 = "Function has to be applied to node set";
    break;
  case 'p':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("position"[lVar20] != pcVar2[lVar20]) goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 0) && ("position"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x16';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e45e;
    }
    break;
  case 'r':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("round"[lVar20] != pcVar2[lVar20]) goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 1) && ("round"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '7';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e92c;
    }
    break;
  case 's':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("substring"[lVar20 + 3] != pcVar2[lVar20]) goto LAB_0012e6a1;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 < 2) && ("substring"[lVar16 + 3] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar5 = ' ';
LAB_0012e4e3:
      cVar5 = cVar5 - (uVar22 == 0);
LAB_0012e4e5:
      pxVar11->_type = cVar5;
      pxVar11->_rettype = '\x03';
      pxVar11->_axis = '\0';
    }
    else {
LAB_0012e6a1:
      pcVar19 = "Unrecognized function or wrong parameter count";
      if (pcVar10 != pcVar2) {
        lVar20 = 0;
        do {
          if ("string-length"[lVar20] != pcVar2[lVar20]) goto LAB_0012e6fd;
          lVar20 = lVar20 + 1;
        } while (lVar16 != lVar20);
      }
      if (1 < uVar22 || "string-length"[lVar16] != '\0') {
LAB_0012e6fd:
        if (pcVar10 != pcVar2) {
          lVar20 = 0;
          do {
            if ("starts-with"[lVar20] != pcVar2[lVar20]) goto LAB_0012e94b;
            lVar20 = lVar20 + 1;
          } while (lVar16 != lVar20);
        }
        if ((uVar22 == 2) && ("starts-with"[lVar16] == '\0')) {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar11->_type = '\"';
          pxVar11->_rettype = '\x04';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
        }
        else {
LAB_0012e94b:
          local_59 = uVar22 == 2;
          if (pcVar10 != pcVar2) {
            lVar20 = 0;
            do {
              if ("substring-before"[lVar20] != pcVar2[lVar20]) goto LAB_0012e9ad;
              lVar20 = lVar20 + 1;
            } while (lVar16 != lVar20);
          }
          if (local_59 && "substring-before"[lVar16] == '\0') {
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '$';
            pxVar11->_rettype = '\x03';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
          }
          else {
LAB_0012e9ad:
            if (pcVar10 != pcVar2) {
              lVar20 = 0;
              do {
                if ("substring-after"[lVar20] != pcVar2[lVar20]) goto LAB_0012ea09;
                lVar20 = lVar20 + 1;
              } while (lVar16 != lVar20);
            }
            if (!local_59 || "substring-after"[lVar16] != '\0') {
LAB_0012ea09:
              if (pcVar10 != pcVar2) {
                lVar20 = 0;
                do {
                  if ("substring"[lVar20] != pcVar2[lVar20]) goto LAB_0012ea8d;
                  lVar20 = lVar20 + 1;
                } while (lVar16 != lVar20);
              }
              if (((uVar22 & 0xfffffffffffffffe) == 2) && ("substring"[lVar16] == '\0')) {
                pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar11 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                bVar6 = local_59 ^ 0x27;
                goto LAB_0012ea64;
              }
LAB_0012ea8d:
              if (pcVar10 != pcVar2) {
                lVar20 = 0;
                do {
                  if ("sum"[lVar20] != pcVar2[lVar20]) goto LAB_0012eafb;
                  lVar20 = lVar20 + 1;
                } while (lVar16 != lVar20);
              }
              if (uVar22 != 1) goto LAB_0012eafb;
              if ("sum"[lVar16] == '\0') {
                if (*(byte *)((long)&(aVar15.variable)->_type + 1) != 1) goto LAB_0012eb03;
                pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar11 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                pxVar11->_type = '4';
                pxVar11->_rettype = '\x02';
                pxVar11->_axis = '\0';
                pxVar11->_test = '\0';
                goto LAB_0012e92c;
              }
              break;
            }
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '%';
            pxVar11->_rettype = '\x03';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
          }
        }
        goto LAB_0012ea73;
      }
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar6 = uVar22 == 0 ^ 0x29;
LAB_0012e91d:
      pxVar11->_type = bVar6;
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
    }
    pxVar11->_test = '\0';
LAB_0012e92c:
    pxVar11->_left = (xpath_ast_node *)aVar15;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    goto LAB_0012dca2;
  case 't':
    lVar16 = (long)pcVar10 - (long)pcVar2;
    if (lVar16 != 0) {
      lVar20 = 0;
      do {
        if ("translate"[lVar20] != pcVar2[lVar20]) goto LAB_0012e400;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 3) && ("translate"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = ',';
      pxVar11->_rettype = '\x03';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012ea73;
    }
LAB_0012e400:
    if (pcVar10 != pcVar2) {
      lVar20 = 0;
      do {
        if ("true"[lVar20] != pcVar2[lVar20]) goto switchD_0012df51_caseD_64;
        lVar20 = lVar20 + 1;
      } while (lVar16 != lVar20);
    }
    if ((uVar22 == 0) && ("true"[lVar16] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '/';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012e45e;
    }
  }
switchD_0012df51_caseD_64:
  pxVar13 = this->_result;
  pxVar13->error = pcVar19;
  goto LAB_0012de2c;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return NULL;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
						if (!n) return NULL;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return NULL;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}